

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void ShiftRows(AES_state *s)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar1 = s->slice[lVar3];
    s->slice[lVar3] =
         uVar1 >> 3 & 0x1000 |
         (uVar1 >> 2 & 0x300 |
         (uVar1 >> 1 & 0x70 | (uVar1 & 0xf) + (uVar1 & 0x10) * 8) + (uVar1 & 0x300) * 4) +
         (uVar1 & 0xf000) * 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 5, 3) | BIT_RANGE_RIGHT(v, 5, 8, 1) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 15, 1) | BIT_RANGE_RIGHT(v, 15, 16, 3);
    }
}